

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::HasItem
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr,uint32 index)

{
  bool bVar1;
  uint uVar2;
  uint32 local_2c;
  void *local_28;
  int i;
  IndexPropertyDescriptor *descriptor;
  
  local_2c = index;
  bVar1 = JsUtil::
          BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<unsigned_int>
                    ((((this->indexPropertyMap).ptr)->indexPropertyMap).ptr,&local_2c,
                     (IndexPropertyDescriptor **)&i,(int *)&local_28);
  if (bVar1) {
    uVar2 = (uint)((_i->Attributes & 8) == 0);
  }
  else {
    uVar2 = JavascriptArray::DirectGetItemAt<void*>(&arr->super_JavascriptArray,index,&local_28);
  }
  return uVar2;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::HasItem(ES5Array* arr, uint32 index)
    {
        // We have the item if we have its descriptor.
        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            return !(descriptor->Attributes & PropertyDeleted);
        }

        // Otherwise check if we have such a data item.
        return HasDataItem(arr, index);
    }